

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_val_anchors_and_refs(Parser *this)

{
  Tree *pTVar1;
  ulong uVar2;
  NodeType_e NVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  csubstr s;
  csubstr s_00;
  char *pcVar7;
  bool bVar8;
  undefined1 uVar9;
  State *pSVar10;
  size_t sVar11;
  undefined8 extraout_RAX;
  long lVar12;
  csubstr rem;
  char msg [31];
  basic_substring<const_char> local_88;
  basic_substring<const_char> local_78;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  pSVar10 = this->m_state;
  if ((pSVar10->flags & 0x40) != 0) {
    uStack_68 = 0x5f736168;
    uStack_64 = 0x28796e61;
    uStack_60 = 0x59454b52;
    uStack_5c = CONCAT13(uStack_5c._3_1_,0x2929);
    local_78.str = (char *)0x6166206b63656863;
    local_78.len._0_4_ = 0x64656c69;
    local_78.len._4_4_ = 0x2128203a;
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      uVar9 = (*pcVar4)();
      return (bool)uVar9;
    }
    local_50 = 0;
    uStack_48 = 0x71a6;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x71a6) << 0x40);
    LVar5.name.str._0_4_ = 0x1fcdc7;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_78,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
  }
  local_88.str = (pSVar10->line_contents).rem.str;
  local_88.len = (pSVar10->line_contents).rem.len;
  if (local_88.len == 0) {
    return false;
  }
  if (*local_88.str != '&') {
    if (*local_88.str != '*') {
      return false;
    }
    _handle_val_anchors_and_refs(this);
    __clang_call_terminate(extraout_RAX);
  }
  sVar11 = basic_substring<const_char>::first_of(&local_88,' ',0);
  if ((sVar11 != 0xffffffffffffffff) && (local_88.len < sVar11)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      uVar9 = (*pcVar4)();
      return (bool)uVar9;
    }
    handle_error(0x1fce74,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1569,"pos <= len || pos == npos");
  }
  if (sVar11 == 0xffffffffffffffff) {
    local_78.str = local_88.str;
    local_78.len._0_4_ = (undefined4)local_88.len;
    local_78.len._4_4_ = (undefined4)(local_88.len >> 0x20);
  }
  else {
    basic_substring<const_char>::basic_substring(&local_78,local_88.str,sVar11);
  }
  pcVar7 = local_78.str;
  sVar11 = CONCAT44(local_78.len._4_4_,(undefined4)local_78.len);
  _line_progressed(this,sVar11);
  if (sVar11 == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      uVar9 = (*pcVar4)();
      return (bool)uVar9;
    }
    handle_error(0x1fce74,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring(&local_78,pcVar7 + 1,sVar11 - 1);
  pcVar7 = local_78.str;
  sVar11 = CONCAT44(local_78.len._4_4_,(undefined4)local_78.len);
  if (((this->m_val_anchor).len == 0) || ((this->m_val_anchor).str == (char *)0x0)) {
LAB_001dba79:
    (this->m_val_anchor).str = pcVar7;
    (this->m_val_anchor).len = sVar11;
    s_00.len = local_88.len;
    s_00.str = local_88.str;
    sVar11 = LineContents::current_col(&this->m_state->line_contents,s_00);
    lVar12 = 0xa60;
  }
  else {
    pTVar1 = this->m_tree;
    uVar2 = this->m_state->node_id;
    if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar4 = (code *)swi(3);
        uVar9 = (*pcVar4)();
        return (bool)uVar9;
      }
      local_78.str = (char *)0x0;
      local_78.len._0_4_ = 0x4b86;
      local_78.len._4_4_ = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0x1fcdc7;
      uStack_5c = 0;
      local_58 = 0x65;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar1->m_buf[uVar2].m_type.type & SEQ) == NOTYPE) {
      return true;
    }
    bVar8 = Tree::has_children(this->m_tree,this->m_state->node_id);
    if (!bVar8) {
      pTVar1 = this->m_tree;
      uVar2 = this->m_state->node_id;
      if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar4 = (code *)swi(3);
          uVar9 = (*pcVar4)();
          return (bool)uVar9;
        }
        local_78.str = (char *)0x0;
        local_78.len._0_4_ = 0x4b86;
        local_78.len._4_4_ = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        uStack_60 = 0x1fcdc7;
        uStack_5c = 0;
        local_58 = 0x65;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      NVar3 = pTVar1->m_buf[uVar2].m_type.type;
      if ((NVar3 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar3 >> 9 & 1) == 0) {
        Tree::set_val_anchor(this->m_tree,this->m_state->node_id,this->m_val_anchor);
        goto LAB_001dba79;
      }
    }
    (this->m_key_anchor).str = pcVar7;
    (this->m_key_anchor).len = sVar11;
    s.len = local_88.len;
    s.str = local_88.str;
    sVar11 = LineContents::current_col(&this->m_state->line_contents,s);
    lVar12 = 0xa48;
  }
  *(size_t *)((long)(this->m_stack).m_buf + lVar12 + -0x38) = sVar11;
  return true;
}

Assistant:

bool Parser::_handle_val_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RKEY));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _c4dbgpf("val: found an anchor: '{}', indentation={}!!!", anchor, m_state->line_contents.current_col(rem));
        if(m_val_anchor.empty())
        {
            _c4dbgpf("save val anchor: '{}'", anchor);
            m_val_anchor = anchor;
            m_val_anchor_indentation = m_state->line_contents.current_col(rem);
        }
        else
        {
            _c4dbgpf("there is a pending val anchor '{}'", m_val_anchor);
            if(m_tree->is_seq(m_state->node_id))
            {
                if(m_tree->has_children(m_state->node_id))
                {
                    _c4dbgpf("current node={} is a seq, has {} children", m_state->node_id, m_tree->num_children(m_state->node_id));
                    _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                    m_key_anchor = anchor;
                    m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                }
                else
                {
                    _c4dbgpf("current node={} is a seq, has no children", m_state->node_id);
                    if(m_tree->has_val_anchor(m_state->node_id))
                    {
                        _c4dbgpf("... node={} already has val anchor: '{}'", m_state->node_id, m_tree->val_anchor(m_state->node_id));
                        _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                        m_key_anchor = anchor;
                        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                    else
                    {
                        _c4dbgpf("... so set pending val anchor: '{}' on current node {}", m_val_anchor, m_state->node_id);
                        m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                        m_val_anchor = anchor;
                        m_val_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                }
            }
        }
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}